

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

ValidationResults *
google::protobuf::FeatureResolver::ValidateFeatureLifetimes
          (ValidationResults *__return_storage_ptr__,Edition edition,FeatureSet *features,
          Descriptor *pool_descriptor)

{
  Message *pMVar1;
  MessageLite *this;
  LogMessage *pLVar2;
  LogMessage local_d8;
  Voidify local_c1;
  string local_c0;
  string_view local_a0;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_80;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_78;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  features_storage;
  DynamicMessageFactory factory;
  Message *pool_features;
  Descriptor *pool_descriptor_local;
  FeatureSet *features_local;
  Edition edition_local;
  ValidationResults *results;
  
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&features_storage);
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>> *
             )&local_78);
  factory.prototypes_mutex_.mu_.super___atomic_base<long>._M_i =
       (atomic<long>)(atomic<long>)features;
  if (pool_descriptor != (Descriptor *)0x0) {
    pMVar1 = DynamicMessageFactory::GetPrototype
                       ((DynamicMessageFactory *)&features_storage,pool_descriptor);
    pMVar1 = Message::New(pMVar1);
    absl::lts_20250127::WrapUnique<google::protobuf::Message>((lts_20250127 *)&local_80,pMVar1);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    operator=(&local_78,&local_80);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_80);
    this = &std::
            unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
            operator->(&local_78)->super_MessageLite;
    MessageLite::SerializeAsString_abi_cxx11_(&local_c0,(MessageLite *)features);
    local_a0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c0);
    MessageLite::ParseFromString(this,local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    factory.prototypes_mutex_.mu_.super___atomic_base<long>._M_i =
         (atomic<long>)
         std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
         ::get(&local_78);
  }
  if ((__atomic_base<long>)factory.prototypes_mutex_.mu_.super___atomic_base<long>._M_i ==
      (__atomic_base<long>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
               ,0x236,"pool_features != nullptr");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_c1,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d8);
  }
  ValidationResults::ValidationResults(__return_storage_ptr__);
  anon_unknown_21::ValidateFeatureLifetimesImpl
            (edition,(Message *)factory.prototypes_mutex_.mu_.super___atomic_base<long>._M_i,
             __return_storage_ptr__);
  std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
  ~unique_ptr(&local_78);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&features_storage);
  return __return_storage_ptr__;
}

Assistant:

FeatureResolver::ValidationResults FeatureResolver::ValidateFeatureLifetimes(
    Edition edition, const FeatureSet& features,
    const Descriptor* pool_descriptor) {
  const Message* pool_features = nullptr;
  DynamicMessageFactory factory;
  std::unique_ptr<Message> features_storage;
  if (pool_descriptor == nullptr) {
    // The FeatureSet descriptor can be null if no custom extensions are defined
    // in any transitive dependency.  In this case, we can just use the
    // generated pool for validation, since there wouldn't be any feature
    // extensions defined anyway.
    pool_features = &features;
  } else {
    // Move the features back to the current pool so that we can reflect on any
    // extensions.
    features_storage =
        absl::WrapUnique(factory.GetPrototype(pool_descriptor)->New());
    features_storage->ParseFromString(features.SerializeAsString());
    pool_features = features_storage.get();
  }
  ABSL_CHECK(pool_features != nullptr);

  ValidationResults results;
  ValidateFeatureLifetimesImpl(edition, *pool_features, results);
  return results;
}